

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charls_jpegls_encoder.cpp
# Opt level: O0

void __thiscall charls_jpegls_encoder::charls_jpegls_encoder(charls_jpegls_encoder *this)

{
  charls_jpegls_encoder *this_local;
  
  (this->frame_info_).width = 0;
  (this->frame_info_).height = 0;
  (this->frame_info_).bits_per_sample = 0;
  (this->frame_info_).component_count = 0;
  this->near_lossless_ = 0;
  this->interleave_mode_ = None;
  this->color_transformation_ = None;
  this->encoding_options_ = include_pc_parameters_jai;
  this->state_ = initial;
  charls::jpeg_stream_writer::jpeg_stream_writer(&this->writer_);
  (this->user_preset_coding_parameters_).maximum_sample_value = 0;
  (this->user_preset_coding_parameters_).threshold1 = 0;
  (this->user_preset_coding_parameters_).threshold2 = 0;
  (this->user_preset_coding_parameters_).threshold3 = 0;
  (this->user_preset_coding_parameters_).reset_value = 0;
  (this->preset_coding_parameters_).maximum_sample_value = 0;
  (this->preset_coding_parameters_).threshold1 = 0;
  (this->preset_coding_parameters_).threshold2 = 0;
  (this->preset_coding_parameters_).threshold3 = 0;
  (this->preset_coding_parameters_).reset_value = 0;
  return;
}

Assistant:

void destination(const byte_span destination)
    {
        check_argument(destination.data || destination.size == 0);
        check_operation(state_ == state::initial);

        writer_.destination(destination);
        state_ = state::destination_set;
    }